

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cpp
# Opt level: O2

bool __thiscall Clasp::Solver::pushRoot(Solver *this,Literal x)

{
  bool bVar1;
  byte bVar2;
  Literal x_local;
  
  if ((this->conflict_).ebo_.size == 0) {
    if ((this->levels_).super_type.ebo_.size != (this->levels_).root) {
      popRootLevel(this,0,(LitVec *)0x0,true);
    }
    if ((this->assign_).trail.ebo_.size != (this->assign_).front) {
      bVar1 = propagate(this);
      if (!bVar1) goto LAB_001622a0;
    }
    bVar2 = *(byte *)((long)(this->assign_).assign_.ebo_.buf + (ulong)(x.rep_ & 0xfffffffc)) & 3;
    if (bVar2 == 0) {
      assume(this,&x_local);
      (this->stats).super_CoreStats.choices = (this->stats).super_CoreStats.choices - 1;
      pushRootLevel(this,1);
      bVar1 = propagate(this);
      return bVar1;
    }
    bVar1 = bVar2 == (byte)(2U - ((x.rep_ & 2) == 0));
  }
  else {
LAB_001622a0:
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool Solver::pushRoot(Literal x) {
	if (hasConflict())                 { return false; }
	if (decisionLevel()!= rootLevel()) { popRootLevel(0);  }
	if (queueSize() && !propagate())   { return false;    }
	if (value(x.var()) != value_free)  { return isTrue(x);}
	assume(x); --stats.choices;
	pushRootLevel();
	return propagate();
}